

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_0::Register
               (MessageLite *containing_type,int number,ExtensionInfo info)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_71;
  string local_70;
  LogMessage local_50;
  
  GoogleOnceInit(&(anonymous_namespace)::registry_init_,InitRegistry);
  local_50._0_8_ = containing_type;
  local_50.filename_._0_4_ = number;
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::MessageLite_const*,int>,google::protobuf::internal::ExtensionInfo,google::protobuf::hash<std::pair<google::protobuf::MessageLite_const*,int>>,std::equal_to<std::pair<google::protobuf::MessageLite_const*,int>>>,std::pair<google::protobuf::MessageLite_const*,int>,google::protobuf::internal::ExtensionInfo>
                    ((anonymous_namespace)::registry_,
                     (pair<const_google::protobuf::MessageLite_*,_int> *)&local_50,&info);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x55);
    pLVar2 = LogMessage::operator<<(&local_50,"Multiple extension registrations for type \"");
    (*containing_type->_vptr_MessageLite[2])(&local_70,containing_type);
    pLVar2 = LogMessage::operator<<(pLVar2,&local_70);
    pLVar2 = LogMessage::operator<<(pLVar2,"\", field number ");
    pLVar2 = LogMessage::operator<<(pLVar2,number);
    pLVar2 = LogMessage::operator<<(pLVar2,".");
    LogFinisher::operator=(&local_71,pLVar2);
    std::__cxx11::string::~string((string *)&local_70);
    LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void Register(const MessageLite* containing_type,
              int number, ExtensionInfo info) {
  ::google::protobuf::GoogleOnceInit(&registry_init_, &InitRegistry);

  if (!InsertIfNotPresent(registry_, make_pair(containing_type, number),
                          info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << containing_type->GetTypeName()
               << "\", field number " << number << ".";
  }
}